

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O0

void swapNotes(vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes,int index1,
              int index2)

{
  value_type this;
  value_type this_00;
  int value;
  int value_00;
  reference ppMVar1;
  MidiEvent *this_01;
  MidiEvent *this_02;
  int pitch2;
  int pitch1;
  MidiEvent *noteoff2;
  MidiEvent *noteoff1;
  MidiEvent *noteon2;
  MidiEvent *noteon1;
  int index2_local;
  int index1_local;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes_local;
  
  ppMVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                      (notes,(long)index1);
  this = *ppMVar1;
  ppMVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                      (notes,(long)index2);
  this_00 = *ppMVar1;
  ppMVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                      (notes,(long)index1);
  this_01 = smf::MidiEvent::getLinkedEvent(*ppMVar1);
  ppMVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::operator[]
                      (notes,(long)index2);
  this_02 = smf::MidiEvent::getLinkedEvent(*ppMVar1);
  if ((((this != (value_type)0x0) && (this_00 != (value_type)0x0)) && (this_01 != (MidiEvent *)0x0))
     && (this_02 != (MidiEvent *)0x0)) {
    value = smf::MidiMessage::getKeyNumber(&this->super_MidiMessage);
    value_00 = smf::MidiMessage::getKeyNumber(&this_00->super_MidiMessage);
    if (((value != value_00) && (-1 < value)) && (-1 < value_00)) {
      smf::MidiMessage::setKeyNumber(&this->super_MidiMessage,value_00);
      smf::MidiMessage::setKeyNumber(&this_01->super_MidiMessage,value_00);
      smf::MidiMessage::setKeyNumber(&this_00->super_MidiMessage,value);
      smf::MidiMessage::setKeyNumber(&this_02->super_MidiMessage,value);
    }
  }
  return;
}

Assistant:

void swapNotes(vector<MidiEvent*>& notes, int index1, int index2) {
   MidiEvent* noteon1  = notes[index1];
   MidiEvent* noteon2  = notes[index2];
   MidiEvent* noteoff1 = notes[index1]->getLinkedEvent();
   MidiEvent* noteoff2 = notes[index2]->getLinkedEvent();
   if (noteon1  == NULL) { return; }
   if (noteon2  == NULL) { return; }
   if (noteoff1 == NULL) { return; }
   if (noteoff2 == NULL) { return; }
   int pitch1 = noteon1->getKeyNumber();
   int pitch2 = noteon2->getKeyNumber();
   if (pitch1 == pitch2) { return; }
   if (pitch1 < 0) { return; }
   if (pitch2 < 0) { return; }

   noteon1->setKeyNumber(pitch2);
   noteoff1->setKeyNumber(pitch2);
   noteon2->setKeyNumber(pitch1);
   noteoff2->setKeyNumber(pitch1);
}